

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_regex.cpp
# Opt level: O1

int main(void)

{
  bool *pbVar1;
  bool bVar2;
  char cVar3;
  int iVar4;
  ostream *poVar5;
  runtime_error *prVar6;
  re_registers *in_R9;
  cmatch cm;
  int prop;
  regex re;
  regex r_8;
  ostringstream oss;
  regex rc;
  cmatch local_a98;
  sub_match<const_char_*> local_a68;
  regex local_a48 [8];
  regex local_a40 [8];
  sub_match<const_char_*> local_a38 [16];
  regex local_8b8 [8];
  undefined1 *local_8b0 [2];
  undefined1 local_8a0 [16];
  undefined1 *local_890 [2];
  undefined1 local_880 [16];
  undefined1 *local_870 [2];
  undefined1 local_860 [16];
  undefined1 *local_850 [2];
  undefined1 local_840 [16];
  undefined1 *local_830 [2];
  undefined1 local_820 [16];
  undefined1 *local_810 [2];
  undefined1 local_800 [16];
  undefined1 *local_7f0 [2];
  undefined1 local_7e0 [16];
  undefined1 *local_7d0 [2];
  undefined1 local_7c0 [16];
  undefined1 *local_7b0 [2];
  undefined1 local_7a0 [16];
  undefined1 *local_790 [2];
  undefined1 local_780 [16];
  undefined1 *local_770 [2];
  undefined1 local_760 [16];
  undefined1 *local_750 [2];
  undefined1 local_740 [16];
  undefined1 *local_730 [2];
  undefined1 local_720 [16];
  undefined1 *local_710 [2];
  undefined1 local_700 [16];
  undefined1 *local_6f0 [2];
  undefined1 local_6e0 [16];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_6d0;
  string local_6b0;
  string local_690;
  string local_670;
  string local_650;
  string local_630;
  string local_610;
  string local_5f0;
  string local_5d0;
  string local_5b0;
  string local_590;
  string local_570;
  string local_550;
  string local_530;
  string local_510;
  string local_4f0;
  string local_4d0;
  string local_4b0;
  string local_490;
  string local_470;
  string local_450;
  string local_430;
  string local_410;
  string local_3f0;
  string local_3d0;
  string local_3b0;
  string local_390;
  string local_370;
  string local_350;
  string local_330;
  string local_310;
  string local_2f0;
  string local_2d0;
  string local_2b0;
  string local_290;
  string local_270;
  string local_250;
  string local_230;
  string local_210;
  string local_1f0;
  string local_1d0;
  string local_1b0;
  string local_190;
  string local_170;
  string local_150;
  string local_130;
  string local_110;
  string local_f0;
  string local_d0;
  string local_b0;
  string local_90;
  string local_70;
  string local_50;
  
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"Testing search/match",0x14);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '\x18');
  std::ostream::put('\x18');
  std::ostream::flush();
  local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,"foo","");
  local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"foo","");
  bVar2 = search(&local_50,&local_70,0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != &local_70.field_2) {
    operator_delete(local_70._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p);
  }
  if (!bVar2) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_a38);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_a38,"Error ",6);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_a38,
               "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/booster/lib/regex/test/test_regex.cpp"
               ,0x6e);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_a38,":",1);
    poVar5 = (ostream *)std::ostream::operator<<((ostream *)local_a38,0xa1);
    std::__ostream_insert<char,std::char_traits<char>>(poVar5," search(\"foo\",\"foo\")",0x14);
    prVar6 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::stringbuf::str();
    std::runtime_error::runtime_error(prVar6,(string *)&local_a98);
    __cxa_throw(prVar6,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_90,"foo","");
  local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_b0,"foobar","");
  bVar2 = search(&local_90,&local_b0,0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
    operator_delete(local_b0._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90._M_dataplus._M_p != &local_90.field_2) {
    operator_delete(local_90._M_dataplus._M_p);
  }
  if (!bVar2) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_a38);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_a38,"Error ",6);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_a38,
               "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/booster/lib/regex/test/test_regex.cpp"
               ,0x6e);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_a38,":",1);
    poVar5 = (ostream *)std::ostream::operator<<((ostream *)local_a38,0xa2);
    std::__ostream_insert<char,std::char_traits<char>>(poVar5," search(\"foo\",\"foobar\")",0x17);
    prVar6 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::stringbuf::str();
    std::runtime_error::runtime_error(prVar6,(string *)&local_a98);
    __cxa_throw(prVar6,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  local_d0._M_dataplus._M_p = (pointer)&local_d0.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_d0,"foo","");
  local_f0._M_dataplus._M_p = (pointer)&local_f0.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_f0,"zeefoo","");
  bVar2 = search(&local_d0,&local_f0,0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f0._M_dataplus._M_p != &local_f0.field_2) {
    operator_delete(local_f0._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
    operator_delete(local_d0._M_dataplus._M_p);
  }
  if (!bVar2) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_a38);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_a38,"Error ",6);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_a38,
               "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/booster/lib/regex/test/test_regex.cpp"
               ,0x6e);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_a38,":",1);
    poVar5 = (ostream *)std::ostream::operator<<((ostream *)local_a38,0xa3);
    std::__ostream_insert<char,std::char_traits<char>>(poVar5," search(\"foo\",\"zeefoo\")",0x17);
    prVar6 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::stringbuf::str();
    std::runtime_error::runtime_error(prVar6,(string *)&local_a98);
    __cxa_throw(prVar6,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  local_110._M_dataplus._M_p = (pointer)&local_110.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_110,"foo","");
  local_130._M_dataplus._M_p = (pointer)&local_130.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_130,"bar","");
  bVar2 = search(&local_110,&local_130,0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_130._M_dataplus._M_p != &local_130.field_2) {
    operator_delete(local_130._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_110._M_dataplus._M_p != &local_110.field_2) {
    operator_delete(local_110._M_dataplus._M_p);
  }
  if (bVar2) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_a38);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_a38,"Error ",6);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_a38,
               "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/booster/lib/regex/test/test_regex.cpp"
               ,0x6e);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_a38,":",1);
    poVar5 = (ostream *)std::ostream::operator<<((ostream *)local_a38,0xa4);
    std::__ostream_insert<char,std::char_traits<char>>(poVar5," !search(\"foo\",\"bar\")",0x15);
    prVar6 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::stringbuf::str();
    std::runtime_error::runtime_error(prVar6,(string *)&local_a98);
    __cxa_throw(prVar6,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  local_150._M_dataplus._M_p = (pointer)&local_150.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_150,"foo","");
  local_170._M_dataplus._M_p = (pointer)&local_170.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_170,"foo","");
  bVar2 = match(&local_150,&local_170,0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_170._M_dataplus._M_p != &local_170.field_2) {
    operator_delete(local_170._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_150._M_dataplus._M_p != &local_150.field_2) {
    operator_delete(local_150._M_dataplus._M_p);
  }
  if (!bVar2) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_a38);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_a38,"Error ",6);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_a38,
               "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/booster/lib/regex/test/test_regex.cpp"
               ,0x6e);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_a38,":",1);
    poVar5 = (ostream *)std::ostream::operator<<((ostream *)local_a38,0xa6);
    std::__ostream_insert<char,std::char_traits<char>>(poVar5," match(\"foo\",\"foo\")",0x13);
    prVar6 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::stringbuf::str();
    std::runtime_error::runtime_error(prVar6,(string *)&local_a98);
    __cxa_throw(prVar6,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  local_190._M_dataplus._M_p = (pointer)&local_190.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_190,"(http|https|ftp|mailto)","")
  ;
  local_1b0._M_dataplus._M_p = (pointer)&local_1b0.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_1b0,"https","");
  bVar2 = match(&local_190,&local_1b0,0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1b0._M_dataplus._M_p != &local_1b0.field_2) {
    operator_delete(local_1b0._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_190._M_dataplus._M_p != &local_190.field_2) {
    operator_delete(local_190._M_dataplus._M_p);
  }
  if (!bVar2) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_a38);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_a38,"Error ",6);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_a38,
               "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/booster/lib/regex/test/test_regex.cpp"
               ,0x6e);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_a38,":",1);
    poVar5 = (ostream *)std::ostream::operator<<((ostream *)local_a38,0xa7);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar5," match(\"(http|https|ftp|mailto)\",\"https\")",0x29);
    prVar6 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::stringbuf::str();
    std::runtime_error::runtime_error(prVar6,(string *)&local_a98);
    __cxa_throw(prVar6,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  local_1d0._M_dataplus._M_p = (pointer)&local_1d0.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_1d0,"foo","");
  local_1f0._M_dataplus._M_p = (pointer)&local_1f0.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_1f0,"zeefoo","");
  bVar2 = match(&local_1d0,&local_1f0,0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1f0._M_dataplus._M_p != &local_1f0.field_2) {
    operator_delete(local_1f0._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1d0._M_dataplus._M_p != &local_1d0.field_2) {
    operator_delete(local_1d0._M_dataplus._M_p);
  }
  if (bVar2) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_a38);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_a38,"Error ",6);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_a38,
               "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/booster/lib/regex/test/test_regex.cpp"
               ,0x6e);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_a38,":",1);
    poVar5 = (ostream *)std::ostream::operator<<((ostream *)local_a38,0xa8);
    std::__ostream_insert<char,std::char_traits<char>>(poVar5," !match(\"foo\",\"zeefoo\")",0x17);
    prVar6 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::stringbuf::str();
    std::runtime_error::runtime_error(prVar6,(string *)&local_a98);
    __cxa_throw(prVar6,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  local_210._M_dataplus._M_p = (pointer)&local_210.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_210,"foo","");
  local_230._M_dataplus._M_p = (pointer)&local_230.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_230,"foobar","");
  bVar2 = match(&local_210,&local_230,0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_230._M_dataplus._M_p != &local_230.field_2) {
    operator_delete(local_230._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_210._M_dataplus._M_p != &local_210.field_2) {
    operator_delete(local_210._M_dataplus._M_p);
  }
  if (bVar2) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_a38);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_a38,"Error ",6);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_a38,
               "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/booster/lib/regex/test/test_regex.cpp"
               ,0x6e);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_a38,":",1);
    poVar5 = (ostream *)std::ostream::operator<<((ostream *)local_a38,0xa9);
    std::__ostream_insert<char,std::char_traits<char>>(poVar5," !match(\"foo\",\"foobar\")",0x17);
    prVar6 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::stringbuf::str();
    std::runtime_error::runtime_error(prVar6,(string *)&local_a98);
    __cxa_throw(prVar6,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  local_250._M_dataplus._M_p = (pointer)&local_250.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_250,"(foo)","");
  local_270._M_dataplus._M_p = (pointer)&local_270.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_270,"foo","");
  bVar2 = match(&local_250,&local_270,0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_270._M_dataplus._M_p != &local_270.field_2) {
    operator_delete(local_270._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_250._M_dataplus._M_p != &local_250.field_2) {
    operator_delete(local_250._M_dataplus._M_p);
  }
  if (!bVar2) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_a38);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_a38,"Error ",6);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_a38,
               "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/booster/lib/regex/test/test_regex.cpp"
               ,0x6e);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_a38,":",1);
    poVar5 = (ostream *)std::ostream::operator<<((ostream *)local_a38,0xaa);
    std::__ostream_insert<char,std::char_traits<char>>(poVar5," match(\"(foo)\",\"foo\")",0x15);
    prVar6 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::stringbuf::str();
    std::runtime_error::runtime_error(prVar6,(string *)&local_a98);
    __cxa_throw(prVar6,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  local_290._M_dataplus._M_p = (pointer)&local_290.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_290,"(foo)","");
  local_2b0._M_dataplus._M_p = (pointer)&local_2b0.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_2b0,"zeefoo","");
  bVar2 = match(&local_290,&local_2b0,0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2b0._M_dataplus._M_p != &local_2b0.field_2) {
    operator_delete(local_2b0._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_290._M_dataplus._M_p != &local_290.field_2) {
    operator_delete(local_290._M_dataplus._M_p);
  }
  if (bVar2) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_a38);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_a38,"Error ",6);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_a38,
               "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/booster/lib/regex/test/test_regex.cpp"
               ,0x6e);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_a38,":",1);
    poVar5 = (ostream *)std::ostream::operator<<((ostream *)local_a38,0xab);
    std::__ostream_insert<char,std::char_traits<char>>(poVar5," !match(\"(foo)\",\"zeefoo\")",0x19);
    prVar6 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::stringbuf::str();
    std::runtime_error::runtime_error(prVar6,(string *)&local_a98);
    __cxa_throw(prVar6,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  local_2d0._M_dataplus._M_p = (pointer)&local_2d0.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_2d0,"(foo)","");
  local_2f0._M_dataplus._M_p = (pointer)&local_2f0.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_2f0,"foobar","");
  bVar2 = match(&local_2d0,&local_2f0,0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2f0._M_dataplus._M_p != &local_2f0.field_2) {
    operator_delete(local_2f0._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2d0._M_dataplus._M_p != &local_2d0.field_2) {
    operator_delete(local_2d0._M_dataplus._M_p);
  }
  if (bVar2) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_a38);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_a38,"Error ",6);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_a38,
               "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/booster/lib/regex/test/test_regex.cpp"
               ,0x6e);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_a38,":",1);
    poVar5 = (ostream *)std::ostream::operator<<((ostream *)local_a38,0xac);
    std::__ostream_insert<char,std::char_traits<char>>(poVar5," !match(\"(foo)\",\"foobar\")",0x19);
    prVar6 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::stringbuf::str();
    std::runtime_error::runtime_error(prVar6,(string *)&local_a98);
    __cxa_throw(prVar6,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  local_310._M_dataplus._M_p = (pointer)&local_310.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_310,"((((((((((foo))))))))))","")
  ;
  local_330._M_dataplus._M_p = (pointer)&local_330.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_330,"foo","");
  bVar2 = match(&local_310,&local_330,0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_330._M_dataplus._M_p != &local_330.field_2) {
    operator_delete(local_330._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_310._M_dataplus._M_p != &local_310.field_2) {
    operator_delete(local_310._M_dataplus._M_p);
  }
  if (!bVar2) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_a38);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_a38,"Error ",6);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_a38,
               "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/booster/lib/regex/test/test_regex.cpp"
               ,0x6e);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_a38,":",1);
    poVar5 = (ostream *)std::ostream::operator<<((ostream *)local_a38,0xad);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar5," match(\"((((((((((foo))))))))))\",\"foo\")",0x27);
    prVar6 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::stringbuf::str();
    std::runtime_error::runtime_error(prVar6,(string *)&local_a98);
    __cxa_throw(prVar6,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  local_350._M_dataplus._M_p = (pointer)&local_350.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_350,"((((((((((foo))))))))))","")
  ;
  local_370._M_dataplus._M_p = (pointer)&local_370.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_370,"foox","");
  bVar2 = match(&local_350,&local_370,0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_370._M_dataplus._M_p != &local_370.field_2) {
    operator_delete(local_370._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_350._M_dataplus._M_p != &local_350.field_2) {
    operator_delete(local_350._M_dataplus._M_p);
  }
  if (bVar2) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_a38);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_a38,"Error ",6);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_a38,
               "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/booster/lib/regex/test/test_regex.cpp"
               ,0x6e);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_a38,":",1);
    poVar5 = (ostream *)std::ostream::operator<<((ostream *)local_a38,0xae);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar5," !match(\"((((((((((foo))))))))))\",\"foox\")",0x29);
    prVar6 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::stringbuf::str();
    std::runtime_error::runtime_error(prVar6,(string *)&local_a98);
    __cxa_throw(prVar6,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  local_390._M_dataplus._M_p = (pointer)&local_390.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_390,"((((((((((foo))))))))))","")
  ;
  local_3b0._M_dataplus._M_p = (pointer)&local_3b0.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_3b0,"xfoo","");
  bVar2 = match(&local_390,&local_3b0,0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3b0._M_dataplus._M_p != &local_3b0.field_2) {
    operator_delete(local_3b0._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_390._M_dataplus._M_p != &local_390.field_2) {
    operator_delete(local_390._M_dataplus._M_p);
  }
  if (bVar2) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_a38);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_a38,"Error ",6);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_a38,
               "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/booster/lib/regex/test/test_regex.cpp"
               ,0x6e);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_a38,":",1);
    poVar5 = (ostream *)std::ostream::operator<<((ostream *)local_a38,0xaf);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar5," !match(\"((((((((((foo))))))))))\",\"xfoo\")",0x29);
    prVar6 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::stringbuf::str();
    std::runtime_error::runtime_error(prVar6,(string *)&local_a98);
    __cxa_throw(prVar6,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  local_3d0._M_dataplus._M_p = (pointer)&local_3d0.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_3d0,"a","");
  local_3f0._M_dataplus._M_p = (pointer)&local_3f0.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_3f0,"A","");
  bVar2 = match(&local_3d0,&local_3f0,0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3f0._M_dataplus._M_p != &local_3f0.field_2) {
    operator_delete(local_3f0._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3d0._M_dataplus._M_p != &local_3d0.field_2) {
    operator_delete(local_3d0._M_dataplus._M_p);
  }
  if (bVar2) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_a38);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_a38,"Error ",6);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_a38,
               "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/booster/lib/regex/test/test_regex.cpp"
               ,0x6e);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_a38,":",1);
    poVar5 = (ostream *)std::ostream::operator<<((ostream *)local_a38,0xb1);
    std::__ostream_insert<char,std::char_traits<char>>(poVar5," !match(\"a\",\"A\",0)",0x12);
    prVar6 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::stringbuf::str();
    std::runtime_error::runtime_error(prVar6,(string *)&local_a98);
    __cxa_throw(prVar6,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  local_410._M_dataplus._M_p = (pointer)&local_410.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_410,"a","");
  local_430._M_dataplus._M_p = (pointer)&local_430.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_430,"xAz","");
  bVar2 = search(&local_410,&local_430,0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_430._M_dataplus._M_p != &local_430.field_2) {
    operator_delete(local_430._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_410._M_dataplus._M_p != &local_410.field_2) {
    operator_delete(local_410._M_dataplus._M_p);
  }
  if (bVar2) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_a38);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_a38,"Error ",6);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_a38,
               "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/booster/lib/regex/test/test_regex.cpp"
               ,0x6e);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_a38,":",1);
    poVar5 = (ostream *)std::ostream::operator<<((ostream *)local_a38,0xb2);
    std::__ostream_insert<char,std::char_traits<char>>(poVar5," !search(\"a\",\"xAz\",0)",0x15);
    prVar6 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::stringbuf::str();
    std::runtime_error::runtime_error(prVar6,(string *)&local_a98);
    __cxa_throw(prVar6,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  local_450._M_dataplus._M_p = (pointer)&local_450.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_450,"a","");
  local_470._M_dataplus._M_p = (pointer)&local_470.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_470,"A","");
  bVar2 = match(&local_450,&local_470,0x100);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_470._M_dataplus._M_p != &local_470.field_2) {
    operator_delete(local_470._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_450._M_dataplus._M_p != &local_450.field_2) {
    operator_delete(local_450._M_dataplus._M_p);
  }
  if (!bVar2) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_a38);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_a38,"Error ",6);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_a38,
               "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/booster/lib/regex/test/test_regex.cpp"
               ,0x6e);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_a38,":",1);
    poVar5 = (ostream *)std::ostream::operator<<((ostream *)local_a38,0xb3);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar5," match(\"a\",\"A\",booster::regex::icase)",0x25);
    prVar6 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::stringbuf::str();
    std::runtime_error::runtime_error(prVar6,(string *)&local_a98);
    __cxa_throw(prVar6,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  local_490._M_dataplus._M_p = (pointer)&local_490.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_490,"a","");
  local_4b0._M_dataplus._M_p = (pointer)&local_4b0.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_4b0,"xAz","");
  bVar2 = search(&local_490,&local_4b0,0x100);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_4b0._M_dataplus._M_p != &local_4b0.field_2) {
    operator_delete(local_4b0._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_490._M_dataplus._M_p != &local_490.field_2) {
    operator_delete(local_490._M_dataplus._M_p);
  }
  if (!bVar2) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_a38);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_a38,"Error ",6);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_a38,
               "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/booster/lib/regex/test/test_regex.cpp"
               ,0x6e);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_a38,":",1);
    poVar5 = (ostream *)std::ostream::operator<<((ostream *)local_a38,0xb4);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar5," search(\"a\",\"xAz\",booster::regex::icase)",0x28);
    prVar6 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::stringbuf::str();
    std::runtime_error::runtime_error(prVar6,(string *)&local_a98);
    __cxa_throw(prVar6,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  cVar3 = booster::regex::utf8_supported();
  if (cVar3 == '\0') {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"UTF-8 is not compiled in",0x18);
    std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
    local_690._M_dataplus._M_p = (pointer)&local_690.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_690,".","");
    local_6b0._M_dataplus._M_p = (pointer)&local_6b0.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_6b0,"a","");
    match(&local_690,&local_6b0,0x200);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_6b0._M_dataplus._M_p != &local_6b0.field_2) {
      operator_delete(local_6b0._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_690._M_dataplus._M_p != &local_690.field_2) {
      operator_delete(local_690._M_dataplus._M_p);
    }
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_a38);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_a38,"Error ",6);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_a38,
               "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/booster/lib/regex/test/test_regex.cpp"
               ,0x6e);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_a38,":",1);
    poVar5 = (ostream *)std::ostream::operator<<((ostream *)local_a38,0xcf);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar5," match(\".\",\"a\",booster::regex::utf8)",0x24);
    prVar6 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::stringbuf::str();
    std::runtime_error::runtime_error(prVar6,(string *)&local_a98);
    __cxa_throw(prVar6,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Testing UTF-8",0xd);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '\x18');
  std::ostream::put('\x18');
  std::ostream::flush();
  local_4d0._M_dataplus._M_p = (pointer)&local_4d0.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_4d0,".","");
  local_4f0._M_dataplus._M_p = (pointer)&local_4f0.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_4f0,anon_var_dwarf_3295,anon_var_dwarf_3295 + 2);
  bVar2 = match(&local_4d0,&local_4f0,0x200);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_4f0._M_dataplus._M_p != &local_4f0.field_2) {
    operator_delete(local_4f0._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_4d0._M_dataplus._M_p != &local_4d0.field_2) {
    operator_delete(local_4d0._M_dataplus._M_p);
  }
  if (bVar2) {
    local_510._M_dataplus._M_p = (pointer)&local_510.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_510,".","");
    local_530._M_dataplus._M_p = (pointer)&local_530.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_530,anon_var_dwarf_32c1,anon_var_dwarf_32c1 + 2);
    bVar2 = match(&local_510,&local_530,0x200);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_530._M_dataplus._M_p != &local_530.field_2) {
      operator_delete(local_530._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_510._M_dataplus._M_p != &local_510.field_2) {
      operator_delete(local_510._M_dataplus._M_p);
    }
    if (!bVar2) {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_a38);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_a38,"Error ",6);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_a38,
                 "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/booster/lib/regex/test/test_regex.cpp"
                 ,0x6e);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_a38,":",1);
      poVar5 = (ostream *)std::ostream::operator<<((ostream *)local_a38,0xbb);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar5," match(\".\",\"\\xD0\\x96\",booster::regex::utf8)",0x2b);
      prVar6 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::__cxx11::stringbuf::str();
      std::runtime_error::runtime_error(prVar6,(string *)&local_a98);
      __cxa_throw(prVar6,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    local_550._M_dataplus._M_p = (pointer)&local_550.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_550,anon_var_dwarf_32c1,anon_var_dwarf_32c1 + 2);
    local_570._M_dataplus._M_p = (pointer)&local_570.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_570,anon_var_dwarf_32d5,anon_var_dwarf_32d5 + 2);
    bVar2 = match(&local_550,&local_570,0x300);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_570._M_dataplus._M_p != &local_570.field_2) {
      operator_delete(local_570._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_550._M_dataplus._M_p != &local_550.field_2) {
      operator_delete(local_550._M_dataplus._M_p);
    }
    if (!bVar2) {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_a38);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_a38,"Error ",6);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_a38,
                 "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/booster/lib/regex/test/test_regex.cpp"
                 ,0x6e);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_a38,":",1);
      poVar5 = (ostream *)std::ostream::operator<<((ostream *)local_a38,0xbc);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar5,
                 " match(\"\\xD0\\x96\",\"\\xD0\\xB6\",booster::regex::icase | booster::regex::utf8)"
                 ,0x4a);
      prVar6 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::__cxx11::stringbuf::str();
      std::runtime_error::runtime_error(prVar6,(string *)&local_a98);
      __cxa_throw(prVar6,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    local_a68.super_pair<const_char_*,_const_char_*>.first =
         (char *)((ulong)local_a68.super_pair<const_char_*,_const_char_*>.first._4_4_ << 0x20);
    pcre_config(6);
    if ((int)local_a68.super_pair<const_char_*,_const_char_*>.first == 0) {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,"Unicode properties not compiled in",0x22);
      std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
      local_650._M_dataplus._M_p = (pointer)&local_650.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_650,"\\p{Hebrew}","");
      local_670._M_dataplus._M_p = (pointer)&local_670.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_670,"a","");
      match(&local_650,&local_670,0x200);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_670._M_dataplus._M_p != &local_670.field_2) {
        operator_delete(local_670._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_650._M_dataplus._M_p != &local_650.field_2) {
        operator_delete(local_650._M_dataplus._M_p);
      }
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_a38);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_a38,"Error ",6);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_a38,
                 "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/booster/lib/regex/test/test_regex.cpp"
                 ,0x6e);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_a38,":",1);
      poVar5 = (ostream *)std::ostream::operator<<((ostream *)local_a38,0xca);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar5," match(\"\\\\p{Hebrew}\",\"a\",booster::regex::utf8)",0x2e);
      prVar6 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::__cxx11::stringbuf::str();
      std::runtime_error::runtime_error(prVar6,(string *)&local_a98);
      __cxa_throw(prVar6,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"Testing Unicode Properties",0x1a);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '\x18');
    std::ostream::put('\x18');
    std::ostream::flush();
    local_590._M_dataplus._M_p = (pointer)&local_590.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_590,"\\p{Hebrew}","");
    local_5b0._M_dataplus._M_p = (pointer)&local_5b0.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_5b0,anon_var_dwarf_3295,anon_var_dwarf_3295 + 2);
    bVar2 = match(&local_590,&local_5b0,0x200);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_5b0._M_dataplus._M_p != &local_5b0.field_2) {
      operator_delete(local_5b0._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_590._M_dataplus._M_p != &local_590.field_2) {
      operator_delete(local_590._M_dataplus._M_p);
    }
    if (!bVar2) {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_a38);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_a38,"Error ",6);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_a38,
                 "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/booster/lib/regex/test/test_regex.cpp"
                 ,0x6e);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_a38,":",1);
      poVar5 = (ostream *)std::ostream::operator<<((ostream *)local_a38,0xc4);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar5," match(\"\\\\p{Hebrew}\",\"\\xD7\\x90\",booster::regex::utf8)",0x35);
      prVar6 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::__cxx11::stringbuf::str();
      std::runtime_error::runtime_error(prVar6,(string *)&local_a98);
      __cxa_throw(prVar6,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    local_5d0._M_dataplus._M_p = (pointer)&local_5d0.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_5d0,"\\p{Hebrew}","");
    local_5f0._M_dataplus._M_p = (pointer)&local_5f0.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_5f0,anon_var_dwarf_32c1,anon_var_dwarf_32c1 + 2);
    bVar2 = match(&local_5d0,&local_5f0,0x200);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_5f0._M_dataplus._M_p != &local_5f0.field_2) {
      operator_delete(local_5f0._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_5d0._M_dataplus._M_p != &local_5d0.field_2) {
      operator_delete(local_5d0._M_dataplus._M_p);
    }
    if (bVar2) {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_a38);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_a38,"Error ",6);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_a38,
                 "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/booster/lib/regex/test/test_regex.cpp"
                 ,0x6e);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_a38,":",1);
      poVar5 = (ostream *)std::ostream::operator<<((ostream *)local_a38,0xc5);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar5," !match(\"\\\\p{Hebrew}\",\"\\xD0\\x96\",booster::regex::utf8)",0x36);
      prVar6 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::__cxx11::stringbuf::str();
      std::runtime_error::runtime_error(prVar6,(string *)&local_a98);
      __cxa_throw(prVar6,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    local_610._M_dataplus._M_p = (pointer)&local_610.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_610,"\\p{Hebrew}","");
    local_630._M_dataplus._M_p = (pointer)&local_630.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_630,"a","");
    bVar2 = match(&local_610,&local_630,0x200);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_630._M_dataplus._M_p != &local_630.field_2) {
      operator_delete(local_630._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_610._M_dataplus._M_p != &local_610.field_2) {
      operator_delete(local_610._M_dataplus._M_p);
    }
    if (bVar2) {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_a38);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_a38,"Error ",6);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_a38,
                 "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/booster/lib/regex/test/test_regex.cpp"
                 ,0x6e);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_a38,":",1);
      poVar5 = (ostream *)std::ostream::operator<<((ostream *)local_a38,0xc6);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar5," !match(\"\\\\p{Hebrew}\",\"a\",booster::regex::utf8)",0x2f);
      prVar6 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::__cxx11::stringbuf::str();
      std::runtime_error::runtime_error(prVar6,(string *)&local_a98);
      __cxa_throw(prVar6,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"Testing match_result",0x14);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '\x18');
    std::ostream::put('\x18');
    std::ostream::flush();
    local_6d0._M_dataplus._M_p = (pointer)&local_6d0.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_6d0,"aab","");
    test_match<std::__cxx11::string,booster::match_results<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>>
              (&local_6d0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_6d0._M_dataplus._M_p != &local_6d0.field_2) {
      operator_delete(local_6d0._M_dataplus._M_p);
    }
    test_match<char_const*,booster::match_results<char_const*>>("aab");
    local_6f0[0] = local_6e0;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_6f0,"foo","");
    local_710[0] = local_700;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_710,"foo","");
    local_730[0] = local_720;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_730,"foo","");
    re_match((re_pattern_buffer *)0x1,(char *)local_6f0,(int)local_710,(int)local_730,
             (re_registers *)0x0);
    if (local_730[0] != local_720) {
      operator_delete(local_730[0]);
    }
    if (local_710[0] != local_700) {
      operator_delete(local_710[0]);
    }
    if (local_6f0[0] != local_6e0) {
      operator_delete(local_6f0[0]);
    }
    local_750[0] = local_740;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_750,"foo","");
    local_770[0] = local_760;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_770,"Foo","");
    local_790[0] = local_780;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_790,"");
    re_match((re_pattern_buffer *)0x0,(char *)local_750,(int)local_770,(int)local_790,
             (re_registers *)0x0);
    if (local_790[0] != local_780) {
      operator_delete(local_790[0]);
    }
    if (local_770[0] != local_760) {
      operator_delete(local_770[0]);
    }
    if (local_750[0] != local_740) {
      operator_delete(local_750[0]);
    }
    local_7b0[0] = local_7a0;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_7b0,"foo","");
    local_7d0[0] = local_7c0;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_7d0,"Foo","");
    local_7f0[0] = local_7e0;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_7f0,"");
    re_search((re_pattern_buffer *)0x0,(char *)local_7b0,(int)local_7d0,(int)local_7f0,0,in_R9);
    if (local_7f0[0] != local_7e0) {
      operator_delete(local_7f0[0]);
    }
    if (local_7d0[0] != local_7c0) {
      operator_delete(local_7d0[0]);
    }
    if (local_7b0[0] != local_7a0) {
      operator_delete(local_7b0[0]);
    }
    local_810[0] = local_800;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_810,"f.o","");
    local_830[0] = local_820;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_830,"foobar","");
    local_850[0] = local_840;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_850,"");
    re_match((re_pattern_buffer *)0x0,(char *)local_810,(int)local_830,(int)local_850,
             (re_registers *)0x0);
    if (local_850[0] != local_840) {
      operator_delete(local_850[0]);
    }
    if (local_830[0] != local_820) {
      operator_delete(local_830[0]);
    }
    if (local_810[0] != local_800) {
      operator_delete(local_810[0]);
    }
    local_870[0] = local_860;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_870,"f.o","");
    local_890[0] = local_880;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_890,"foobar","");
    local_8b0[0] = local_8a0;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_8b0,"foo","");
    re_search((re_pattern_buffer *)0x1,(char *)local_870,(int)local_890,(int)local_8b0,0,in_R9);
    if (local_8b0[0] != local_8a0) {
      operator_delete(local_8b0[0]);
    }
    if (local_890[0] != local_880) {
      operator_delete(local_890[0]);
    }
    if (local_870[0] != local_860) {
      operator_delete(local_870[0]);
    }
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"Testing regex match/search",0x1a);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '\x18');
    std::ostream::put('\x18');
    std::ostream::flush();
    pbVar1 = &local_a38[0].matched;
    local_a38[0].super_pair<const_char_*,_const_char_*>.first = pbVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_a38,"foo","");
    booster::regex::regex(local_a48,(string *)local_a38,0);
    if ((bool *)local_a38[0].super_pair<const_char_*,_const_char_*>.first != pbVar1) {
      operator_delete(local_a38[0].super_pair<const_char_*,_const_char_*>.first);
    }
    local_a98.offsets_.
    super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    local_a98.offsets_.
    super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    local_a98.begin_ = (char *)0x0;
    local_a98.end_ = (char *)0x0;
    local_a98.offsets_.
    super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    bVar2 = booster::regex_search<booster::regex>("foo",&local_a98,local_a48,0);
    if (!bVar2) {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_a38);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_a38,"Error ",6);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_a38,
                 "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/booster/lib/regex/test/test_regex.cpp"
                 ,0x6e);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_a38,":",1);
      poVar5 = (ostream *)std::ostream::operator<<((ostream *)local_a38,0xdf);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar5," booster::regex_search(\"foo\",cm,re)",0x23);
      prVar6 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::__cxx11::stringbuf::str();
      std::runtime_error::runtime_error(prVar6,(string *)&local_a68);
      __cxa_throw(prVar6,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    local_a38[0].super_pair<const_char_*,_const_char_*>.first = (char *)0x0;
    local_a38[0].super_pair<const_char_*,_const_char_*>.second = (char *)0x0;
    local_a38[0].matched = false;
    if ((local_a98.offsets_.
         super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>._M_impl.
         super__Vector_impl_data._M_start !=
         local_a98.offsets_.
         super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>._M_impl.
         super__Vector_impl_data._M_finish) &&
       ((long)(local_a98.offsets_.
               super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>.
               _M_impl.super__Vector_impl_data._M_start)->first != 0)) {
      local_a38[0].matched = true;
      local_a38[0].super_pair<const_char_*,_const_char_*>.first = local_a98.begin_;
      local_a38[0].super_pair<const_char_*,_const_char_*>.second =
           local_a98.begin_ +
           (local_a98.offsets_.
            super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>._M_impl.
            super__Vector_impl_data._M_start)->first;
    }
    iVar4 = booster::sub_match<const_char_*>::compare(local_a38,"");
    if (iVar4 == 0) {
      local_a68.super_pair<const_char_*,_const_char_*>.first = (char *)0x0;
      local_a68.super_pair<const_char_*,_const_char_*>.second = (char *)0x0;
      local_a68.matched = false;
      if (local_a98.offsets_.
          super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>._M_impl.
          super__Vector_impl_data._M_start !=
          local_a98.offsets_.
          super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>._M_impl.
          super__Vector_impl_data._M_finish) {
        local_a68.super_pair<const_char_*,_const_char_*>.second = local_a98.end_;
        local_a68.super_pair<const_char_*,_const_char_*>.first =
             local_a98.begin_ +
             local_a98.offsets_.
             super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>._M_impl.
             super__Vector_impl_data._M_finish[-1].second;
        local_a68.matched = local_a68.super_pair<const_char_*,_const_char_*>.first != local_a98.end_
        ;
      }
      iVar4 = booster::sub_match<const_char_*>::compare(&local_a68,"");
      if (iVar4 == 0) {
        bVar2 = booster::regex_search<booster::regex>("foobee",&local_a98,local_a48,0);
        if (!bVar2) {
          std::__cxx11::ostringstream::ostringstream((ostringstream *)local_a38);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_a38,"Error ",6);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_a38,
                     "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/booster/lib/regex/test/test_regex.cpp"
                     ,0x6e);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_a38,":",1);
          poVar5 = (ostream *)std::ostream::operator<<((ostream *)local_a38,0xe2);
          std::__ostream_insert<char,std::char_traits<char>>
                    (poVar5," booster::regex_search(\"foobee\",cm,re)",0x26);
          prVar6 = (runtime_error *)__cxa_allocate_exception(0x10);
          std::__cxx11::stringbuf::str();
          std::runtime_error::runtime_error(prVar6,(string *)&local_a68);
          __cxa_throw(prVar6,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
        }
        local_a38[0].super_pair<const_char_*,_const_char_*>.first = (char *)0x0;
        local_a38[0].super_pair<const_char_*,_const_char_*>.second = (char *)0x0;
        local_a38[0].matched = false;
        if ((local_a98.offsets_.
             super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>._M_impl.
             super__Vector_impl_data._M_start !=
             local_a98.offsets_.
             super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>._M_impl.
             super__Vector_impl_data._M_finish) &&
           ((long)(local_a98.offsets_.
                   super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>.
                   _M_impl.super__Vector_impl_data._M_start)->first != 0)) {
          local_a38[0].matched = true;
          local_a38[0].super_pair<const_char_*,_const_char_*>.first = local_a98.begin_;
          local_a38[0].super_pair<const_char_*,_const_char_*>.second =
               local_a98.begin_ +
               (local_a98.offsets_.
                super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>.
                _M_impl.super__Vector_impl_data._M_start)->first;
        }
        iVar4 = booster::sub_match<const_char_*>::compare(local_a38,"");
        if (iVar4 == 0) {
          local_a68.super_pair<const_char_*,_const_char_*>.first = (char *)0x0;
          local_a68.super_pair<const_char_*,_const_char_*>.second = (char *)0x0;
          local_a68.matched = false;
          if (local_a98.offsets_.
              super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>._M_impl
              .super__Vector_impl_data._M_start !=
              local_a98.offsets_.
              super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>._M_impl
              .super__Vector_impl_data._M_finish) {
            local_a68.super_pair<const_char_*,_const_char_*>.second = local_a98.end_;
            local_a68.super_pair<const_char_*,_const_char_*>.first =
                 local_a98.begin_ +
                 local_a98.offsets_.
                 super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>.
                 _M_impl.super__Vector_impl_data._M_finish[-1].second;
            local_a68.matched =
                 local_a68.super_pair<const_char_*,_const_char_*>.first != local_a98.end_;
          }
          iVar4 = booster::sub_match<const_char_*>::compare(&local_a68,"bee");
          if (iVar4 == 0) {
            bVar2 = booster::regex_search<booster::regex>("zfoo",&local_a98,local_a48,0);
            if (!bVar2) {
              std::__cxx11::ostringstream::ostringstream((ostringstream *)local_a38);
              std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_a38,"Error ",6);
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_a38,
                         "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/booster/lib/regex/test/test_regex.cpp"
                         ,0x6e);
              std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_a38,":",1);
              poVar5 = (ostream *)std::ostream::operator<<((ostream *)local_a38,0xe5);
              std::__ostream_insert<char,std::char_traits<char>>
                        (poVar5," booster::regex_search(\"zfoo\",cm,re)",0x24);
              prVar6 = (runtime_error *)__cxa_allocate_exception(0x10);
              std::__cxx11::stringbuf::str();
              std::runtime_error::runtime_error(prVar6,(string *)&local_a68);
              __cxa_throw(prVar6,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
            }
            local_a38[0].super_pair<const_char_*,_const_char_*>.first = (char *)0x0;
            local_a38[0].super_pair<const_char_*,_const_char_*>.second = (char *)0x0;
            local_a38[0].matched = false;
            if ((local_a98.offsets_.
                 super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>.
                 _M_impl.super__Vector_impl_data._M_start !=
                 local_a98.offsets_.
                 super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>.
                 _M_impl.super__Vector_impl_data._M_finish) &&
               ((long)(local_a98.offsets_.
                       super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
                       ._M_impl.super__Vector_impl_data._M_start)->first != 0)) {
              local_a38[0].matched = true;
              local_a38[0].super_pair<const_char_*,_const_char_*>.first = local_a98.begin_;
              local_a38[0].super_pair<const_char_*,_const_char_*>.second =
                   local_a98.begin_ +
                   (local_a98.offsets_.
                    super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>.
                    _M_impl.super__Vector_impl_data._M_start)->first;
            }
            iVar4 = booster::sub_match<const_char_*>::compare(local_a38,"z");
            if (iVar4 == 0) {
              local_a68.super_pair<const_char_*,_const_char_*>.first = (char *)0x0;
              local_a68.super_pair<const_char_*,_const_char_*>.second = (char *)0x0;
              local_a68.matched = false;
              if (local_a98.offsets_.
                  super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>.
                  _M_impl.super__Vector_impl_data._M_start !=
                  local_a98.offsets_.
                  super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>.
                  _M_impl.super__Vector_impl_data._M_finish) {
                local_a68.super_pair<const_char_*,_const_char_*>.second = local_a98.end_;
                local_a68.super_pair<const_char_*,_const_char_*>.first =
                     local_a98.begin_ +
                     local_a98.offsets_.
                     super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>.
                     _M_impl.super__Vector_impl_data._M_finish[-1].second;
                local_a68.matched =
                     local_a68.super_pair<const_char_*,_const_char_*>.first != local_a98.end_;
              }
              iVar4 = booster::sub_match<const_char_*>::compare(&local_a68,"");
              if (iVar4 == 0) {
                bVar2 = booster::regex_search<booster::regex>("zfoobee",&local_a98,local_a48,0);
                if (!bVar2) {
                  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_a38);
                  std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)local_a38,"Error ",6);
                  std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)local_a38,
                             "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/booster/lib/regex/test/test_regex.cpp"
                             ,0x6e);
                  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_a38,":",1);
                  poVar5 = (ostream *)std::ostream::operator<<((ostream *)local_a38,0xe8);
                  std::__ostream_insert<char,std::char_traits<char>>
                            (poVar5," booster::regex_search(\"zfoobee\",cm,re)",0x27);
                  prVar6 = (runtime_error *)__cxa_allocate_exception(0x10);
                  std::__cxx11::stringbuf::str();
                  std::runtime_error::runtime_error(prVar6,(string *)&local_a68);
                  __cxa_throw(prVar6,&std::runtime_error::typeinfo,
                              std::runtime_error::~runtime_error);
                }
                local_a38[0].super_pair<const_char_*,_const_char_*>.first = (char *)0x0;
                local_a38[0].super_pair<const_char_*,_const_char_*>.second = (char *)0x0;
                local_a38[0].matched = false;
                if ((local_a98.offsets_.
                     super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>.
                     _M_impl.super__Vector_impl_data._M_start !=
                     local_a98.offsets_.
                     super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>.
                     _M_impl.super__Vector_impl_data._M_finish) &&
                   ((long)(local_a98.offsets_.
                           super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
                           ._M_impl.super__Vector_impl_data._M_start)->first != 0)) {
                  local_a38[0].matched = true;
                  local_a38[0].super_pair<const_char_*,_const_char_*>.first = local_a98.begin_;
                  local_a38[0].super_pair<const_char_*,_const_char_*>.second =
                       local_a98.begin_ +
                       (local_a98.offsets_.
                        super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
                        ._M_impl.super__Vector_impl_data._M_start)->first;
                }
                iVar4 = booster::sub_match<const_char_*>::compare(local_a38,"z");
                if (iVar4 == 0) {
                  local_a68.super_pair<const_char_*,_const_char_*>.first = (char *)0x0;
                  local_a68.super_pair<const_char_*,_const_char_*>.second = (char *)0x0;
                  local_a68.matched = false;
                  if (local_a98.offsets_.
                      super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
                      ._M_impl.super__Vector_impl_data._M_start !=
                      local_a98.offsets_.
                      super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish) {
                    local_a68.super_pair<const_char_*,_const_char_*>.second = local_a98.end_;
                    local_a68.super_pair<const_char_*,_const_char_*>.first =
                         local_a98.begin_ +
                         local_a98.offsets_.
                         super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
                         ._M_impl.super__Vector_impl_data._M_finish[-1].second;
                    local_a68.matched =
                         local_a68.super_pair<const_char_*,_const_char_*>.first != local_a98.end_;
                  }
                  iVar4 = booster::sub_match<const_char_*>::compare(&local_a68,"bee");
                  if (iVar4 == 0) {
                    std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)&std::cout,"Testing regex ctor/operator=",0x1c);
                    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '\x18');
                    std::ostream::put('\x18');
                    std::ostream::flush();
                    booster::regex::regex(local_a40);
                    local_a38[0].super_pair<const_char_*,_const_char_*>.first = pbVar1;
                    std::__cxx11::string::_M_construct<char_const*>((string *)local_a38,"(t(x))","")
                    ;
                    booster::regex::assign((string *)local_a40,(int)local_a38);
                    if ((bool *)local_a38[0].super_pair<const_char_*,_const_char_*>.first != pbVar1)
                    {
                      operator_delete(local_a38[0].super_pair<const_char_*,_const_char_*>.first);
                    }
                    booster::regex::str_abi_cxx11_();
                    iVar4 = std::__cxx11::string::compare((char *)local_a38);
                    if ((bool *)local_a38[0].super_pair<const_char_*,_const_char_*>.first != pbVar1)
                    {
                      operator_delete(local_a38[0].super_pair<const_char_*,_const_char_*>.first);
                    }
                    if (iVar4 != 0) {
                      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_a38);
                      std::__ostream_insert<char,std::char_traits<char>>
                                ((ostream *)local_a38,"Error ",6);
                      std::__ostream_insert<char,std::char_traits<char>>
                                ((ostream *)local_a38,
                                 "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/booster/lib/regex/test/test_regex.cpp"
                                 ,0x6e);
                      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_a38,":",1)
                      ;
                      poVar5 = (ostream *)std::ostream::operator<<((ostream *)local_a38,0xef);
                      std::__ostream_insert<char,std::char_traits<char>>
                                (poVar5," r.str()==\"(t(x))\"",0x12);
                      prVar6 = (runtime_error *)__cxa_allocate_exception(0x10);
                      std::__cxx11::stringbuf::str();
                      std::runtime_error::runtime_error(prVar6,(string *)&local_a68);
                      __cxa_throw(prVar6,&std::runtime_error::typeinfo,
                                  std::runtime_error::~runtime_error);
                    }
                    iVar4 = booster::regex::mark_count();
                    if (iVar4 != 2) {
                      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_a38);
                      std::__ostream_insert<char,std::char_traits<char>>
                                ((ostream *)local_a38,"Error ",6);
                      std::__ostream_insert<char,std::char_traits<char>>
                                ((ostream *)local_a38,
                                 "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/booster/lib/regex/test/test_regex.cpp"
                                 ,0x6e);
                      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_a38,":",1)
                      ;
                      poVar5 = (ostream *)std::ostream::operator<<((ostream *)local_a38,0xf0);
                      std::__ostream_insert<char,std::char_traits<char>>
                                (poVar5," r.mark_count() == 2",0x14);
                      prVar6 = (runtime_error *)__cxa_allocate_exception(0x10);
                      std::__cxx11::stringbuf::str();
                      std::runtime_error::runtime_error(prVar6,(string *)&local_a68);
                      __cxa_throw(prVar6,&std::runtime_error::typeinfo,
                                  std::runtime_error::~runtime_error);
                    }
                    booster::regex::regex(local_8b8,local_a40);
                    cVar3 = booster::regex::match((char *)local_8b8,"tx",0x1179f8);
                    if (cVar3 != '\0') {
                      cVar3 = booster::regex::match((char *)local_8b8,"ty",0x117a1a);
                      if (cVar3 != '\0') {
                        std::__cxx11::ostringstream::ostringstream((ostringstream *)local_a38);
                        std::__ostream_insert<char,std::char_traits<char>>
                                  ((ostream *)local_a38,"Error ",6);
                        std::__ostream_insert<char,std::char_traits<char>>
                                  ((ostream *)local_a38,
                                   "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/booster/lib/regex/test/test_regex.cpp"
                                   ,0x6e);
                        std::__ostream_insert<char,std::char_traits<char>>
                                  ((ostream *)local_a38,":",1);
                        poVar5 = (ostream *)std::ostream::operator<<((ostream *)local_a38,0xf3);
                        std::__ostream_insert<char,std::char_traits<char>>
                                  (poVar5," !booster::regex_match(\"ty\",rc)",0x1f);
                        prVar6 = (runtime_error *)__cxa_allocate_exception(0x10);
                        std::__cxx11::stringbuf::str();
                        std::runtime_error::runtime_error(prVar6,(string *)&local_a68);
                        __cxa_throw(prVar6,&std::runtime_error::typeinfo,
                                    std::runtime_error::~runtime_error);
                      }
                      booster::regex::operator=(local_a48,local_a40);
                      cVar3 = booster::regex::match((char *)local_a48,"tx",0x1179f8);
                      if (cVar3 != '\0') {
                        cVar3 = booster::regex::match((char *)local_a48,"ty",0x117a1a);
                        if (cVar3 == '\0') {
                          booster::regex::~regex(local_8b8);
                          booster::regex::~regex(local_a40);
                          if (local_a98.offsets_.
                              super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
                              ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
                            operator_delete(local_a98.offsets_.
                                            super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
                                            ._M_impl.super__Vector_impl_data._M_start);
                          }
                          booster::regex::~regex(local_a48);
                          std::__ostream_insert<char,std::char_traits<char>>
                                    ((ostream *)&std::cout,"Ok",2);
                          std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '\x18');
                          std::ostream::put('\x18');
                          std::ostream::flush();
                          return 0;
                        }
                        std::__cxx11::ostringstream::ostringstream((ostringstream *)local_a38);
                        std::__ostream_insert<char,std::char_traits<char>>
                                  ((ostream *)local_a38,"Error ",6);
                        std::__ostream_insert<char,std::char_traits<char>>
                                  ((ostream *)local_a38,
                                   "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/booster/lib/regex/test/test_regex.cpp"
                                   ,0x6e);
                        std::__ostream_insert<char,std::char_traits<char>>
                                  ((ostream *)local_a38,":",1);
                        poVar5 = (ostream *)std::ostream::operator<<((ostream *)local_a38,0xf8);
                        std::__ostream_insert<char,std::char_traits<char>>
                                  (poVar5," !booster::regex_match(\"ty\",re)",0x1f);
                        prVar6 = (runtime_error *)__cxa_allocate_exception(0x10);
                        std::__cxx11::stringbuf::str();
                        std::runtime_error::runtime_error(prVar6,(string *)&local_a68);
                        __cxa_throw(prVar6,&std::runtime_error::typeinfo,
                                    std::runtime_error::~runtime_error);
                      }
                      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_a38);
                      std::__ostream_insert<char,std::char_traits<char>>
                                ((ostream *)local_a38,"Error ",6);
                      std::__ostream_insert<char,std::char_traits<char>>
                                ((ostream *)local_a38,
                                 "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/booster/lib/regex/test/test_regex.cpp"
                                 ,0x6e);
                      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_a38,":",1)
                      ;
                      poVar5 = (ostream *)std::ostream::operator<<((ostream *)local_a38,0xf7);
                      std::__ostream_insert<char,std::char_traits<char>>
                                (poVar5," booster::regex_match(\"tx\",re)",0x1e);
                      prVar6 = (runtime_error *)__cxa_allocate_exception(0x10);
                      std::__cxx11::stringbuf::str();
                      std::runtime_error::runtime_error(prVar6,(string *)&local_a68);
                      __cxa_throw(prVar6,&std::runtime_error::typeinfo,
                                  std::runtime_error::~runtime_error);
                    }
                    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_a38);
                    std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)local_a38,"Error ",6);
                    std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)local_a38,
                               "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/booster/lib/regex/test/test_regex.cpp"
                               ,0x6e);
                    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_a38,":",1);
                    poVar5 = (ostream *)std::ostream::operator<<((ostream *)local_a38,0xf2);
                    std::__ostream_insert<char,std::char_traits<char>>
                              (poVar5," booster::regex_match(\"tx\",rc)",0x1e);
                    prVar6 = (runtime_error *)__cxa_allocate_exception(0x10);
                    std::__cxx11::stringbuf::str();
                    std::runtime_error::runtime_error(prVar6,(string *)&local_a68);
                    __cxa_throw(prVar6,&std::runtime_error::typeinfo,
                                std::runtime_error::~runtime_error);
                  }
                }
                std::__cxx11::ostringstream::ostringstream((ostringstream *)local_a38);
                std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_a38,"Error ",6);
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)local_a38,
                           "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/booster/lib/regex/test/test_regex.cpp"
                           ,0x6e);
                std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_a38,":",1);
                poVar5 = (ostream *)std::ostream::operator<<((ostream *)local_a38,0xe9);
                std::__ostream_insert<char,std::char_traits<char>>
                          (poVar5," cm.prefix()==\"z\" && cm.suffix()==\"bee\"",0x27);
                prVar6 = (runtime_error *)__cxa_allocate_exception(0x10);
                std::__cxx11::stringbuf::str();
                std::runtime_error::runtime_error(prVar6,(string *)&local_a68);
                __cxa_throw(prVar6,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error)
                ;
              }
            }
            std::__cxx11::ostringstream::ostringstream((ostringstream *)local_a38);
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_a38,"Error ",6);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_a38,
                       "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/booster/lib/regex/test/test_regex.cpp"
                       ,0x6e);
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_a38,":",1);
            poVar5 = (ostream *)std::ostream::operator<<((ostream *)local_a38,0xe6);
            std::__ostream_insert<char,std::char_traits<char>>
                      (poVar5," cm.prefix()==\"z\" && cm.suffix()==\"\"",0x24);
            prVar6 = (runtime_error *)__cxa_allocate_exception(0x10);
            std::__cxx11::stringbuf::str();
            std::runtime_error::runtime_error(prVar6,(string *)&local_a68);
            __cxa_throw(prVar6,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
          }
        }
        std::__cxx11::ostringstream::ostringstream((ostringstream *)local_a38);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_a38,"Error ",6);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_a38,
                   "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/booster/lib/regex/test/test_regex.cpp"
                   ,0x6e);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_a38,":",1);
        poVar5 = (ostream *)std::ostream::operator<<((ostream *)local_a38,0xe3);
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar5," cm.prefix()==\"\" && cm.suffix()==\"bee\"",0x26);
        prVar6 = (runtime_error *)__cxa_allocate_exception(0x10);
        std::__cxx11::stringbuf::str();
        std::runtime_error::runtime_error(prVar6,(string *)&local_a68);
        __cxa_throw(prVar6,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
      }
    }
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_a38);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_a38,"Error ",6);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_a38,
               "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/booster/lib/regex/test/test_regex.cpp"
               ,0x6e);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_a38,":",1);
    poVar5 = (ostream *)std::ostream::operator<<((ostream *)local_a38,0xe0);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar5," cm.prefix()==\"\" && cm.suffix()==\"\"",0x23);
    prVar6 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::stringbuf::str();
    std::runtime_error::runtime_error(prVar6,(string *)&local_a68);
    __cxa_throw(prVar6,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_a38);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_a38,"Error ",6);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_a38,
             "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/booster/lib/regex/test/test_regex.cpp"
             ,0x6e);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_a38,":",1);
  poVar5 = (ostream *)std::ostream::operator<<((ostream *)local_a38,0xba);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar5," match(\".\",\"\\xD7\\x90\",booster::regex::utf8)",0x2b);
  prVar6 = (runtime_error *)__cxa_allocate_exception(0x10);
  std::__cxx11::stringbuf::str();
  std::runtime_error::runtime_error(prVar6,(string *)&local_a98);
  __cxa_throw(prVar6,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

int main()
{
	try {
		{
			std::cout << "Testing search/match" << std::endl;
			TEST(search("foo","foo"));
			TEST(search("foo","foobar"));
			TEST(search("foo","zeefoo"));
			TEST(!search("foo","bar"));

			TEST(match("foo","foo"));
			TEST(match("(http|https|ftp|mailto)","https"));
			TEST(!match("foo","zeefoo"));
			TEST(!match("foo","foobar"));
			TEST(match("(foo)","foo"));
			TEST(!match("(foo)","zeefoo"));
			TEST(!match("(foo)","foobar"));
			TEST(match("((((((((((foo))))))))))","foo"));
			TEST(!match("((((((((((foo))))))))))","foox"));
			TEST(!match("((((((((((foo))))))))))","xfoo"));
			
			TEST(!match("a","A",0));
			TEST(!search("a","xAz",0));
			TEST(match("a","A",booster::regex::icase));
			TEST(search("a","xAz",booster::regex::icase));


			if(booster::regex::utf8_supported()) {

				std::cout << "Testing UTF-8" << std::endl;
				TEST(match(".","\xD7\x90",booster::regex::utf8));
				TEST(match(".","\xD0\x96",booster::regex::utf8));
				TEST(match("\xD0\x96","\xD0\xB6",booster::regex::icase | booster::regex::utf8));

				int prop=0;
				#ifndef BOOSTER_NO_PCRE
				pcre_config(PCRE_CONFIG_UNICODE_PROPERTIES,&prop);
				#endif
				if(prop) {
					std::cout << "Testing Unicode Properties" << std::endl;
					TEST(match("\\p{Hebrew}","\xD7\x90",booster::regex::utf8));
					TEST(!match("\\p{Hebrew}","\xD0\x96",booster::regex::utf8));
					TEST(!match("\\p{Hebrew}","a",booster::regex::utf8));
				}
				else {
					std::cout << "Unicode properties not compiled in" << std::endl;
					THROWS(match("\\p{Hebrew}","a",booster::regex::utf8),booster::regex_error);
				}
			}
			else {
				std::cout << "UTF-8 is not compiled in" << std::endl;
				THROWS(match(".","a",booster::regex::utf8),booster::regex_error);
			}
			
			std::cout << "Testing match_result" << std::endl;
			test_match<std::string,booster::smatch>("aab");
			test_match<char const *,booster::cmatch>("aab");

			re_match(true,"foo","foo","foo",0);
			re_match(false,"foo","Foo");
			re_search(false,"foo","Foo");
			re_match(false,"f.o","foobar");
			re_search(true,"f.o","foobar","foo",0);

			std::cout << "Testing regex match/search" << std::endl;
			booster::regex re("foo");
			booster::cmatch cm;
			TEST(booster::regex_search("foo",cm,re));
			TEST(cm.prefix()=="" && cm.suffix()=="");
			
			TEST(booster::regex_search("foobee",cm,re));
			TEST(cm.prefix()=="" && cm.suffix()=="bee");
			
			TEST(booster::regex_search("zfoo",cm,re));
			TEST(cm.prefix()=="z" && cm.suffix()=="");

			TEST(booster::regex_search("zfoobee",cm,re));
			TEST(cm.prefix()=="z" && cm.suffix()=="bee");

			{
				std::cout << "Testing regex ctor/operator=" << std::endl;
				booster::regex r;
				r.assign("(t(x))");
				TEST(r.str()=="(t(x))");
				TEST(r.mark_count() == 2);
				booster::regex rc(r);
				TEST(booster::regex_match("tx",rc));
				TEST(!booster::regex_match("ty",rc));

				re = r;

				TEST(booster::regex_match("tx",re));
				TEST(!booster::regex_match("ty",re));

			}

		}
	}
	catch(std::exception const &e) {
		std::cerr << "Fail: " << e.what() << std::endl;
		return 1;
	}
	std::cout << "Ok" << std::endl;
	return 0;
}